

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O3

bool __thiscall TileGate::updateNextState(TileGate *this)

{
  Direction DVar1;
  State SVar2;
  int iVar3;
  State SVar4;
  Vector2u *pVVar5;
  Board *pBVar6;
  Tile *pTVar7;
  int i;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint numInputs;
  int numMiddle;
  State adjacentStates [4];
  State local_38 [4];
  Vector2u local_28;
  
  pVVar5 = Tile::getPosition(&this->super_Tile);
  iVar3 = 0;
  local_38[0] = DISCONNECTED;
  if (pVVar5->y != 0) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y - 1;
    local_28.x = uVar10;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    local_38[0] = (*pTVar7->_vptr_Tile[7])(pTVar7,0);
  }
  pVVar5 = Tile::getPosition(&this->super_Tile);
  uVar10 = pVVar5->x;
  pBVar6 = Tile::getBoardPtr(&this->super_Tile);
  pVVar5 = Board::getSize(pBVar6);
  if (uVar10 < pVVar5->x - 1) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y;
    local_28.x = uVar10 + 1;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    iVar3 = (*pTVar7->_vptr_Tile[7])(pTVar7,1);
  }
  local_38[1] = iVar3;
  pVVar5 = Tile::getPosition(&this->super_Tile);
  uVar10 = pVVar5->y;
  pBVar6 = Tile::getBoardPtr(&this->super_Tile);
  pVVar5 = Board::getSize(pBVar6);
  iVar3 = 0;
  local_38[2] = 0;
  if (uVar10 < pVVar5->y - 1) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y + 1;
    local_28.x = uVar10;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    local_38[2] = (*pTVar7->_vptr_Tile[7])(pTVar7,2);
  }
  pVVar5 = Tile::getPosition(&this->super_Tile);
  if (pVVar5->x != 0) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y;
    local_28.x = uVar10 - 1;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    iVar3 = (*pTVar7->_vptr_Tile[7])(pTVar7,3);
  }
  local_38[3] = iVar3;
  DVar1 = (this->super_Tile)._direction;
  uVar9 = 0;
  iVar3 = 0;
  uVar10 = 0;
  numInputs = 0;
  do {
    if ((DVar1 != uVar9) && (SVar4 = local_38[uVar9], SVar4 != DISCONNECTED)) {
      numInputs = numInputs + 1;
      if (SVar4 == MIDDLE) {
        iVar3 = iVar3 + 1;
      }
      else if (SVar4 == HIGH) {
        uVar10 = uVar10 + 1;
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 4);
  numMiddle = 0;
  if (Board::enableExtraLogicStates != false) {
    numMiddle = iVar3;
  }
  if (this->_connectorChange != false) {
    uVar8 = DVar1 + 4;
    if (-1 < (int)(DVar1 + EAST)) {
      uVar8 = DVar1 + EAST;
    }
    SVar4 = local_38[(int)((DVar1 - (uVar8 & 0xfffffffc)) + 1)];
    this->_rightConnector = SVar4 != DISCONNECTED;
    uVar8 = DVar1 + 6;
    if (-1 < (int)(DVar1 + WEST)) {
      uVar8 = DVar1 + WEST;
    }
    SVar2 = local_38[(int)((DVar1 - (uVar8 & 0xfffffffc)) + 3)];
    this->_leftConnector = SVar2 != DISCONNECTED;
    if (((*(int *)&(this->super_Tile).field_0x24 < 3) && (SVar4 != DISCONNECTED)) &&
       (SVar2 != DISCONNECTED)) {
      this->_rightConnector = false;
      this->_leftConnector = false;
    }
    this->_connectorChange = false;
    (*(this->super_Tile)._vptr_Tile[8])(this,1,0);
  }
  switch(*(undefined4 *)&(this->super_Tile).field_0x24) {
  case 0:
    if (numInputs == 1) {
      if (uVar10 == 1) {
        this->_nextState = HIGH;
        SVar4 = HIGH;
        goto LAB_0013a3da;
      }
      if (numMiddle == 1) {
        this->_nextState = MIDDLE;
        SVar4 = MIDDLE;
        goto LAB_0013a3da;
      }
    }
    this->_nextState = LOW;
    SVar4 = LOW;
    goto LAB_0013a3da;
  case 1:
    SVar4 = _findNextStateBuffer(this,local_38,numInputs,uVar10,numMiddle);
    break;
  case 2:
    SVar4 = _findNextStateBuffer(this,local_38,numInputs,uVar10,numMiddle);
    if (SVar4 == LOW) {
LAB_0013a3d2:
      SVar4 = HIGH;
    }
    else if (SVar4 == HIGH) goto LAB_0013a390;
    break;
  case 3:
    if (((int)numInputs < 2) ||
       ((SVar4 = HIGH, uVar10 != numInputs && (SVar4 = MIDDLE, numMiddle + uVar10 != numInputs)))) {
LAB_0013a390:
      SVar4 = LOW;
    }
    break;
  case 4:
    if (((int)numInputs < 2) ||
       ((SVar4 = LOW, uVar10 != numInputs && (SVar4 = MIDDLE, numMiddle + uVar10 != numInputs))))
    goto LAB_0013a3d2;
    break;
  case 5:
    if (((int)numInputs < 2) || ((SVar4 = HIGH, (int)uVar10 < 1 && (SVar4 = MIDDLE, numMiddle < 1)))
       ) goto LAB_0013a390;
    break;
  case 6:
    if (((int)numInputs < 2) || ((SVar4 = LOW, (int)uVar10 < 1 && (SVar4 = MIDDLE, numMiddle < 1))))
    goto LAB_0013a3d2;
    break;
  case 7:
    if (((int)numInputs < 2) ||
       ((SVar4 = MIDDLE, numMiddle == 0 && (SVar4 = HIGH, (uVar10 & 0x80000001) != 1))))
    goto LAB_0013a390;
    break;
  case 8:
    if (((int)numInputs < 2) ||
       ((SVar4 = MIDDLE, numMiddle == 0 && (SVar4 = LOW, (uVar10 & 0x80000001) != 1))))
    goto LAB_0013a3d2;
    break;
  default:
    SVar4 = this->_nextState;
    goto LAB_0013a3da;
  }
  this->_nextState = SVar4;
LAB_0013a3da:
  return SVar4 != this->_state;
}

Assistant:

bool TileGate::updateNextState() {
    State adjacentStates[4];
    adjacentStates[0] = getPosition().y > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1))->checkOutput(NORTH) : DISCONNECTED;
    adjacentStates[1] = getPosition().x < getBoardPtr()->getSize().x - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y))->checkOutput(EAST) : DISCONNECTED;
    adjacentStates[2] = getPosition().y < getBoardPtr()->getSize().y - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1))->checkOutput(SOUTH) : DISCONNECTED;
    adjacentStates[3] = getPosition().x > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y))->checkOutput(WEST) : DISCONNECTED;
    
    int numInputs = 0, numHigh = 0, numMiddle = 0;
    for (int i = 0; i < 4; ++i) {
        if (i != _direction && adjacentStates[i] != DISCONNECTED) {
            ++numInputs;
            if (adjacentStates[i] == HIGH) {
                ++numHigh;
            } else if (adjacentStates[i] == MIDDLE) {
                ++numMiddle;
            }
        }
    }
    if (!Board::enableExtraLogicStates) {
        numMiddle = 0;
    }
    if (_connectorChange) {
        _rightConnector = (adjacentStates[(_direction + 1) % 4] != DISCONNECTED);
        _leftConnector = (adjacentStates[(_direction + 3) % 4] != DISCONNECTED);
        if (_type < AND && _rightConnector && _leftConnector) {
            _rightConnector = false;
            _leftConnector = false;
        }
        _connectorChange = false;
        addUpdate(true);
    }
    
    if (_type == DIODE) {
        if (numInputs == 1) {
            if (numHigh == 1) {
                _nextState = HIGH;
            } else if (numMiddle == 1) {
                _nextState = MIDDLE;
            } else {
                _nextState = LOW;
            }
        } else {
            _nextState = LOW;
        }
    } else if (_type == BUFFER) {
        _nextState = _findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOT) {
        _nextState = _complementState(_findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == AND) {
        _nextState = _findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NAND) {
        _nextState = _complementState(_findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == OR) {
        _nextState = _findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOR) {
        _nextState = _complementState(_findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == XOR) {
        _nextState = _findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == XNOR) {
        _nextState = _complementState(_findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle));
    }
    
    //cout << "Gate at (" << getPosition().x << ", " << getPosition().y << ") checked for state change:" << endl;
    //cout << "  aS = [" << adjacentStates[0] << ", " << adjacentStates[1] << ", " << adjacentStates[2] << ", " << adjacentStates[3] << "]" << endl;
    //cout << "  state = " << _state << ", next = " << _nextState << endl;
    
    return _nextState != _state;
}